

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

void Sbd_StoFree(Sbd_Sto_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Mem_t *pVVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  pVVar1 = p->vDelays;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLevels;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vRefs;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  __ptr = p->vCuts;
  if (0 < __ptr->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar5);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        *(undefined8 *)((long)&__ptr->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < __ptr->nCap);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  if ((p->fCutMin != 0) && (pVVar2 = p->vTtMem, pVVar2 != (Vec_Mem_t *)0x0)) {
    if (pVVar2->vTable != (Vec_Int_t *)0x0) {
      piVar3 = pVVar2->vTable->pArray;
      if (piVar3 != (int *)0x0) {
        free(piVar3);
        pVVar2->vTable->pArray = (int *)0x0;
      }
      if (pVVar2->vTable != (Vec_Int_t *)0x0) {
        free(pVVar2->vTable);
        pVVar2->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar2->vNexts != (Vec_Int_t *)0x0) {
      piVar3 = pVVar2->vNexts->pArray;
      if (piVar3 != (int *)0x0) {
        free(piVar3);
        pVVar2->vNexts->pArray = (int *)0x0;
      }
      if (pVVar2->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar2->vNexts);
        pVVar2->vNexts = (Vec_Int_t *)0x0;
      }
    }
  }
  if (p->fCutMin != 0) {
    pVVar2 = p->vTtMem;
    if (-1 < pVVar2->iPage) {
      lVar4 = -1;
      do {
        if (pVVar2->ppPages[lVar4 + 1] != (word *)0x0) {
          free(pVVar2->ppPages[lVar4 + 1]);
          pVVar2->ppPages[lVar4 + 1] = (word *)0x0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->iPage);
    }
    if (pVVar2->ppPages != (word **)0x0) {
      free(pVVar2->ppPages);
      pVVar2->ppPages = (word **)0x0;
    }
    if (pVVar2 != (Vec_Mem_t *)0x0) {
      free(pVVar2);
    }
  }
  if (p != (Sbd_Sto_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sbd_StoFree( Sbd_Sto_t * p )
{
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vLevels );
    Vec_IntFree( p->vRefs );
    Vec_WecFree( p->vCuts );
    if ( p->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}